

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<QString>>
          (QtPrivate *this,QDebug debug,char *which,QList<QString> *c)

{
  char *pcVar1;
  long lVar2;
  storage_type *psVar3;
  QString *pQVar4;
  QString *pQVar5;
  storage_type *psVar6;
  char16_t *pcVar7;
  QTextStream *pQVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QDebugStateSaver saver;
  undefined8 local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar8 = *(QTextStream **)debug.stream;
  pQVar8[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar6 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar6 = psVar3 + 1;
      pcVar1 = which + 1 + (long)psVar3;
      psVar3 = psVar6;
    } while (*pcVar1 != '\0');
  }
  QVar9.m_data = psVar6;
  QVar9.m_size = (qsizetype)&local_50;
  QString::fromUtf8(QVar9);
  QTextStream::operator<<(pQVar8,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar8 = *(QTextStream **)debug.stream;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar8,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  pQVar5 = (c->d).ptr;
  lVar2 = (c->d).size;
  pQVar4 = pQVar5 + lVar2;
  if (lVar2 != 0) {
    pcVar7 = (pQVar5->d).ptr;
    if (pcVar7 == (char16_t *)0x0) {
      pcVar7 = (char16_t *)&QString::_empty;
    }
    QDebug::putString((QChar *)debug.stream,(ulong)pcVar7);
    if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
    }
    pQVar5 = pQVar5 + 1;
  }
  if (pQVar5 != pQVar4) {
    do {
      pQVar8 = *(QTextStream **)debug.stream;
      QVar10.m_data = (storage_type *)0x2;
      QVar10.m_size = (qsizetype)&local_50;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<(pQVar8,&local_50);
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      pcVar7 = (pQVar5->d).ptr;
      if (pcVar7 == (char16_t *)0x0) {
        pcVar7 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)debug.stream,(ulong)pcVar7);
      if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
        QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
      }
      pQVar5 = pQVar5 + 1;
    } while (pQVar5 != pQVar4);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar8 = *(QTextStream **)debug.stream;
  if (pQVar8[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar8,' ');
    pQVar8 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar8;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}